

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O1

LitVec * __thiscall Clasp::mt::ParallelSolve::SharedData::requestWork(SharedData *this,Solver *s)

{
  atomic<int> *paVar1;
  int iVar2;
  __int_type_conflict2 _Var3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  LitVec *pLVar7;
  unique_lock<std::mutex> lock;
  undefined1 local_40 [16];
  char *local_30;
  undefined8 local_28;
  
  if (((this->initVec).super___atomic_base<unsigned_long>._M_i >> ((ulong)s->strategy_ >> 0x3a) & 1)
      == 0) {
LAB_0017fd64:
    if (((this->control).super___atomic_base<unsigned_int>._M_i & 0x40) == 0) {
      pLVar7 = (LitVec *)0x0;
    }
    else {
      local_40._0_4_ =
           (Event_t<Clasp::mt::MessageEvent>::id_s & 0xffff) * 0x1000 +
           (local_40._0_4_ & 0xf0000000) + 0xb;
      local_30 = "SPLIT";
      local_28 = 0;
      local_40._8_8_ = s;
      SharedContext::report(this->ctx,(Event *)local_40);
      local_40._0_8_ = &this->workM;
      local_40._8_8_ = local_40._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
      local_40[8] = true;
      pLVar7 = (LitVec *)0x0;
      while (((this->control).super___atomic_base<unsigned_int>._M_i & 3) == 0) {
        uVar4 = (this->workQ).vec.ebo_.size;
        uVar5 = (this->workQ).qFront;
        if (uVar5 != uVar4) {
          (this->workQ).qFront = uVar5 + 1;
          pLVar7 = (this->workQ).vec.ebo_.buf[uVar5];
          if (uVar5 + 1 == uVar4) {
            (this->workQ).vec.ebo_.size = 0;
            (this->workQ).qFront = 0;
          }
          break;
        }
        LOCK();
        paVar1 = &this->workReq;
        iVar2 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        if (iVar2 == 0) {
          updateSplitFlag(this);
        }
        bVar6 = enterWait(this,(unique_lock<std::mutex> *)local_40);
        if (!bVar6) break;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
      SharedContext::report(this->ctx,"resume after wait",s);
    }
  }
  else {
    if (((this->control).super___atomic_base<unsigned_int>._M_i & 0x40) == 0) {
      LOCK();
      (this->initVec).super___atomic_base<unsigned_long>._M_i =
           (this->initVec).super___atomic_base<unsigned_long>._M_i -
           (1L << (SUB81(s->strategy_,7) >> 2));
      UNLOCK();
    }
    else {
      LOCK();
      _Var3 = (this->initVec).super___atomic_base<unsigned_long>._M_i;
      (this->initVec).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if (_Var3 == 0) goto LAB_0017fd64;
    }
    pLVar7 = this->path;
  }
  return pLVar7;
}

Assistant:

const LitVec* requestWork(const Solver& s) {
		const uint64 m(uint64(1) << s.id());
		if ((initVec & m) == m) {
			if (!allowSplit()) {
				// portfolio mode - all solvers can start with initial path
				initVec -= m;
				return path;
			}
			if (initVec.exchange(0) != 0) {
				// splitting mode - only one solver must start with initial path
				return path;
			}
		}
		if (!allowSplit()) { return 0; }
		ctx->report(MessageEvent(s, "SPLIT", MessageEvent::sent));
		// try to get work from split
		const LitVec* ret = 0;
		for (unique_lock<mutex> lock(workM); !hasControl(uint32(terminate_flag|sync_flag));) {
			if (!workQ.empty()) {
				ret = workQ.pop_ret();
				if (workQ.empty()) { workQ.clear(); }
				break;
			}
			postMessage(msg_split, false);
			if (!enterWait(lock))
				break;
		}
		ctx->report("resume after wait", &s);
		return ret;
	}